

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O1

string * __thiscall
czh::utils::
to_czhstr<std::vector<std::variant<czh::value::Null,int,long_long,double,bool,std::__cxx11::string>,std::allocator<std::variant<czh::value::Null,int,long_long,double,bool,std::__cxx11::string>>>>
          (string *__return_storage_ptr__,utils *this,Array *v,Color color)

{
  long lVar1;
  undefined4 in_register_0000000c;
  variant<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pvVar2;
  variant<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pvVar3;
  anon_class_8_1_a7c11e83 visitor;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_48;
  anon_class_8_1_a7c11e83 local_40;
  Color local_34;
  
  local_40.color = &local_34;
  local_34 = (Color)v;
  local_48 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_48;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,"{","",CONCAT44(in_register_0000000c,color));
  pvVar3 = *(variant<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             **)this;
  lVar1 = *(long *)(this + 8);
  pvVar2 = (variant<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)(lVar1 + -0x28);
  if (pvVar3 != pvVar2) {
    do {
      (*std::__detail::__variant::
        __gen_vtable<std::__detail::__variant::__deduce_visit_result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/caozhanhao[P]wxserver/thirdparty/libczh/include/libczh/utils.hpp:192:20)_&,_const_std::variant<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
        ::_S_vtable._M_arr
        [(pvVar3->
         super__Variant_base<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         ).
         super__Move_assign_alias<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char>_>
         .
         super__Copy_assign_alias<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char>_>
         .
         super__Move_ctor_alias<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char>_>
         .
         super__Copy_ctor_alias<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char>_>
         .
         super__Variant_storage_alias<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char>_>
         ._M_index]._M_data)(&local_68,&local_40,pvVar3);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                (__return_storage_ptr__,local_68._M_dataplus._M_p,local_68._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != &local_68.field_2) {
        operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (__return_storage_ptr__,",");
      pvVar3 = pvVar3 + 1;
      lVar1 = *(long *)(this + 8);
      pvVar2 = (variant<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)(lVar1 + -0x28);
    } while (pvVar3 != pvVar2);
  }
  (*std::__detail::__variant::
    __gen_vtable<std::__detail::__variant::__deduce_visit_result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/caozhanhao[P]wxserver/thirdparty/libczh/include/libczh/utils.hpp:192:20)_&,_const_std::variant<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
    ::_S_vtable._M_arr[*(byte *)(lVar1 + -8)]._M_data)(&local_68,&local_40,pvVar2);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
            (__return_storage_ptr__,local_68._M_dataplus._M_p,local_68._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            (__return_storage_ptr__,"}");
  return __return_storage_ptr__;
}

Assistant:

std::string to_czhstr(const value::Array &v, Color color)
  {
    auto visitor = [&color](auto &&v) -> std::string { return to_czhstr(v, color); };
    std::string result = "{";
    for (auto it = v.cbegin(); it != std::prev(v.cend()); ++it)
    {
      result += std::visit(visitor, *it);
      result += ",";
    }
    result += std::visit(visitor, *std::prev(v.cend()));
    result += "}";
    return result;
  }